

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.h
# Opt level: O1

void __thiscall
capnp::Orphan<capnp::DynamicValue>::Orphan
          (Orphan<capnp::DynamicValue> *this,Builder *value,OrphanBuilder *builder)

{
  Type TVar1;
  char *pcVar2;
  size_t sVar3;
  
  TVar1 = value->type;
  this->type = TVar1;
  (this->builder).segment = builder->segment;
  (this->builder).capTable = builder->capTable;
  (this->builder).location = builder->location;
  (this->builder).tag.content = (builder->tag).content;
  builder->segment = (SegmentBuilder *)0x0;
  builder->location = (word *)0x0;
  switch(TVar1) {
  case BOOL:
    (this->field_1).boolValue = (value->field_1).boolValue;
    return;
  case INT:
  case UINT:
  case STRUCT:
    sVar3 = (value->field_1).intValue;
    break;
  case FLOAT:
    (this->field_1).intValue = (value->field_1).intValue;
    return;
  default:
    goto switchD_001cefaf_caseD_6;
  case LIST:
    pcVar2 = (value->field_1).textValue.content.ptr;
    (this->field_1).intValue = (value->field_1).intValue;
    *(char **)((long)&this->field_1 + 8) = pcVar2;
    return;
  case ENUM:
    (this->field_1).enumValue.value =
         *(uint16_t *)&(value->field_1).listValue.schema.elementType.field_4;
    (this->field_1).intValue = (value->field_1).intValue;
    return;
  case CAPABILITY:
    sVar3 = (value->field_1).textValue.content.size_;
  }
  (this->field_1).intValue = sVar3;
switchD_001cefaf_caseD_6:
  return;
}

Assistant:

inline Type getType() { return type; }